

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS
ref_split_edge_density
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  REF_INT cell;
  REF_DBL area;
  REF_INT nodes [27];
  double local_f0;
  REF_INT local_e4;
  REF_NODE local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  uint *local_b8;
  ulong local_b0;
  REF_INT local_a8 [30];
  
  local_e0 = ref_grid->node;
  *allowed = 1;
  if (ref_grid->twod != 0) {
    ref_cell = ref_grid->cell[3];
    local_b0 = 0xffffffff;
    if (-1 < node0) {
      local_b0 = 0xffffffff;
      if (node0 < ref_cell->ref_adj->nnode) {
        local_b0 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
      }
    }
    local_b8 = (uint *)allowed;
    if ((int)local_b0 == -1) {
      local_d8 = 0.0;
      local_c8 = 0.0;
    }
    else {
      cell = ref_cell->ref_adj->item[(int)local_b0].ref;
      local_c8 = 0.0;
      uStack_c0 = 0;
      local_d8 = 0.0;
      uStack_d0 = 0;
      do {
        if (0 < ref_cell->node_per) {
          iVar4 = 0;
          local_e4 = cell;
          do {
            if (ref_cell->c2n[ref_cell->size_per * cell + iVar4] == node1) {
              uVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x2d0,"ref_split_edge_density",(ulong)uVar2,"cell nodes");
                return uVar2;
              }
              if (0 < ref_cell->node_per) {
                lVar3 = 0;
                do {
                  if (local_a8[lVar3] == node0) {
                    local_a8[lVar3] = new_node;
                  }
                  lVar3 = lVar3 + 1;
                } while (lVar3 < ref_cell->node_per);
              }
              uVar2 = ref_node_tri_metric_area(local_e0,local_a8,&local_f0);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x2d4,"ref_split_edge_density",(ulong)uVar2,"tri area");
                return uVar2;
              }
              local_c8 = local_c8 + 1.0;
              if (0 < ref_cell->node_per) {
                lVar3 = 0;
                do {
                  if (local_a8[lVar3] == new_node) {
                    local_a8[lVar3] = node0;
                  }
                  lVar3 = lVar3 + 1;
                } while (lVar3 < ref_cell->node_per);
              }
              if (0 < ref_cell->node_per) {
                lVar3 = 0;
                do {
                  if (local_a8[lVar3] == node1) {
                    local_a8[lVar3] = new_node;
                  }
                  lVar3 = lVar3 + 1;
                } while (lVar3 < ref_cell->node_per);
              }
              local_d8 = local_d8 + local_f0;
              uVar2 = ref_node_tri_metric_area(local_e0,local_a8,&local_f0);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x2de,"ref_split_edge_density",(ulong)uVar2,"tri area");
                return uVar2;
              }
              local_d8 = local_d8 + local_f0;
              local_c8 = local_c8 + 1.0;
              cell = local_e4;
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < ref_cell->node_per);
        }
        pRVar1 = ref_cell->ref_adj->item;
        iVar4 = pRVar1[(int)local_b0].next;
        local_b0 = (ulong)iVar4;
        if (local_b0 == 0xffffffffffffffff) {
          cell = -1;
        }
        else {
          cell = pRVar1[local_b0].ref;
        }
      } while (iVar4 != -1);
    }
    *local_b8 = (uint)(0.5 < (double)(~-(ulong)(0.5 < local_c8) & (ulong)local_d8 |
                                     (ulong)(local_d8 / local_c8) & -(ulong)(0.5 < local_c8)));
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_density(REF_GRID ref_grid, REF_INT node0,
                                          REF_INT node1, REF_INT new_node,
                                          REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL area, density, hits;

  *allowed = REF_TRUE;

  if (!ref_grid_twod(ref_grid)) {
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);

  density = 0.0;
  hits = 0.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;
  }

  if (hits > 0.5) density /= hits;

  if (density > 0.5) {
    *allowed = REF_TRUE;
  } else {
    *allowed = REF_FALSE;
  }

  return REF_SUCCESS;
}